

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,wally_tx **output)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t sequence;
  wally_tx *pwVar3;
  uint64_t uVar4;
  int iVar5;
  undefined8 in_RAX;
  size_t sVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  uchar *puVar12;
  uchar *puVar13;
  uint64_t *puVar14;
  undefined1 free_parent;
  ulong uVar15;
  wally_tx_witness_stack **output_00;
  uint64_t *puVar16;
  uint32_t *nonce;
  uchar *puVar17;
  uchar *txhash;
  uint32_t *puVar18;
  uint32_t *puVar19;
  long lVar20;
  int iVar21;
  byte *pbVar22;
  bool bVar23;
  uint64_t tmp;
  uint64_t num_witnesses;
  uint64_t issuance_amount_len;
  uint64_t inflation_keys_len;
  uint64_t nonce_len;
  uint32_t *local_a0;
  uint32_t *local_98;
  uint64_t *local_90;
  uint32_t *local_88;
  uint64_t local_80;
  wally_tx *local_78;
  ulong local_70;
  uint64_t local_68;
  uint32_t *local_60;
  uint local_54;
  uint32_t *local_50;
  uint64_t local_48;
  wally_tx **local_40;
  uchar *local_38;
  
  if (output == (wally_tx **)0x0) {
    return -2;
  }
  *output = (wally_tx *)0x0;
  local_60 = (uint32_t *)bytes;
  local_40 = output;
  if (flags < 0x10 && (5 < bytes_len && bytes != (uchar *)0x0)) {
    if ((flags & 2) == 0) {
      pbVar10 = bytes + 4;
      if ((flags < 8) && (*pbVar10 == 0)) {
        if (bytes[5] != '\x01') goto LAB_0011149b;
        pbVar10 = bytes + 6;
        bVar23 = true;
        goto LAB_0011128f;
      }
      local_70 = 0;
    }
    else {
      if (7 < flags) goto LAB_0011149b;
      pbVar10 = bytes + 5;
      bVar23 = bytes[4] != '\0';
LAB_0011128f:
      local_70 = CONCAT71((int7)((ulong)in_RAX >> 8),bVar23);
    }
    pbVar22 = bytes + bytes_len;
    if ((pbVar22 < pbVar10) ||
       (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6)) {
      local_88 = (uint32_t *)0x0;
      local_a0 = (uint32_t *)0x0;
    }
    else {
      sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
      local_a0 = local_98;
      pbVar10 = pbVar10 + sVar6;
      if (local_98 != (uint32_t *)0x0) {
        puVar18 = (uint32_t *)0x0;
        do {
          pbVar9 = pbVar10;
          if ((pbVar22 < pbVar10) || (pbVar11 = pbVar10 + 0x24, pbVar22 < pbVar11)) {
LAB_00111302:
            bVar23 = false;
            pbVar10 = pbVar9;
          }
          else {
            bVar23 = false;
            if (((flags & 2) != 0) &&
               (((bVar23 = false, *(int *)(pbVar10 + 0x20) < 0 &&
                 (bVar23 = true, *(int *)(pbVar10 + 0x20) == -1)) && (*pbVar10 == 0)))) {
              uVar7 = 0xffffffffffffffff;
              do {
                if (uVar7 == 0x1e) {
                  uVar15 = 0x1f;
                  break;
                }
                uVar15 = uVar7 + 1;
                lVar20 = uVar7 + 2;
                uVar7 = uVar15;
              } while (pbVar10[lVar20] == 0);
              bVar23 = uVar15 < 0x1f;
            }
            sVar6 = varint_length_from_bytes(pbVar11);
            if (pbVar11 + sVar6 <= pbVar22) {
              sVar6 = varint_from_bytes(pbVar11,(uint64_t *)&local_98);
              pbVar11 = pbVar11 + sVar6;
              if (((pbVar11 <= pbVar22) &&
                  (pbVar8 = (byte *)((long)local_98 + (long)pbVar11), pbVar8 <= pbVar22)) &&
                 (pbVar10 = pbVar8 + 4, pbVar11 = pbVar8, pbVar10 <= pbVar22)) {
                if (bVar23) {
                  pbVar11 = pbVar8 + 0x44;
                  pbVar9 = pbVar10;
                  if (pbVar22 < pbVar11) goto LAB_00111302;
                  bVar1 = *pbVar11;
                  if (bVar1 - 8 < 2) {
                    pbVar9 = pbVar8 + 0x65;
LAB_00111416:
                    if (pbVar9 <= pbVar22) {
                      bVar1 = *pbVar9;
                      if (bVar1 - 8 < 2) {
                        pbVar10 = pbVar9 + 0x21;
                      }
                      else if (bVar1 == 1) {
                        pbVar10 = pbVar9 + 9;
                      }
                      else {
                        if (bVar1 != 0) goto LAB_00111302;
                        pbVar10 = pbVar9 + 1;
                      }
                      if (pbVar22 < pbVar10) goto LAB_00111302;
                      goto LAB_00111408;
                    }
                  }
                  else {
                    if (bVar1 == 1) {
                      pbVar9 = pbVar8 + 0x4d;
                      goto LAB_00111416;
                    }
                    if (bVar1 == 0) {
                      pbVar9 = pbVar8 + 0x45;
                      goto LAB_00111416;
                    }
                  }
                  bVar23 = false;
                  pbVar10 = pbVar11;
                }
                else {
LAB_00111408:
                  bVar23 = true;
                }
                goto LAB_001113a0;
              }
            }
            bVar23 = false;
            pbVar10 = pbVar11;
          }
LAB_001113a0:
          if (!bVar23) {
            local_88 = (uint32_t *)0x0;
            goto LAB_00111b6c;
          }
          puVar18 = (uint32_t *)((long)puVar18 + 1);
        } while (puVar18 != local_a0);
      }
      if ((pbVar22 < pbVar10) ||
         (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6)) {
        local_88 = (uint32_t *)0x0;
      }
      else {
        sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
        pbVar10 = pbVar10 + sVar6;
        local_88 = local_98;
        for (puVar18 = local_98; puVar18 != (uint32_t *)0x0;
            puVar18 = (uint32_t *)((long)puVar18 + -1)) {
          if ((flags & 2) == 0) {
            bVar23 = false;
            if ((pbVar22 < pbVar10) || (pbVar10 = pbVar10 + 8, pbVar22 < pbVar10))
            goto LAB_001114b8;
          }
          else {
            bVar1 = *pbVar10;
            if ((bVar1 - 10 < 2) || (bVar1 == 1)) {
              bVar23 = false;
              if (pbVar22 < pbVar10) goto LAB_001114b8;
              pbVar10 = pbVar10 + 0x21;
            }
            else {
              if (bVar1 != 0) goto LAB_001114b6;
              bVar23 = false;
              if (pbVar22 < pbVar10) goto LAB_001114b8;
              pbVar10 = pbVar10 + 1;
            }
            bVar23 = false;
            if (pbVar22 < pbVar10) goto LAB_001114b8;
            bVar1 = *pbVar10;
            if (bVar1 - 8 < 2) {
              pbVar10 = pbVar10 + 0x21;
            }
            else if (bVar1 == 1) {
              pbVar10 = pbVar10 + 9;
            }
            else {
              if (bVar1 != 0) goto LAB_001114b6;
              pbVar10 = pbVar10 + 1;
            }
            if (pbVar22 < pbVar10) goto LAB_001114b6;
            bVar1 = *pbVar10;
            if ((bVar1 - 2 < 2) || (bVar1 == 1)) {
              pbVar10 = pbVar10 + 0x21;
            }
            else {
              if (bVar1 != 0) goto LAB_001114b6;
              pbVar10 = pbVar10 + 1;
            }
            if (pbVar22 < pbVar10) goto LAB_00111b6c;
          }
          sVar6 = varint_length_from_bytes(pbVar10);
          if (pbVar22 < pbVar10 + sVar6) goto LAB_00111b6c;
          sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
          if (pbVar22 < pbVar10 + sVar6) goto LAB_00111b6c;
          pbVar10 = pbVar10 + sVar6 + (long)local_98;
          if (pbVar22 < pbVar10) goto LAB_001114b6;
        }
        if (((char)local_70 == '\x01' && (char)((flags & 2) >> 1) == '\0') &&
            local_a0 != (uint32_t *)0x0) {
          puVar18 = (uint32_t *)0x0;
          do {
            if ((pbVar22 < pbVar10) ||
               (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
            goto LAB_00111b6c;
            sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_90);
            pbVar10 = pbVar10 + sVar6;
            if (local_90 != (uint64_t *)0x0) {
              puVar14 = (uint64_t *)0x0;
              do {
                if ((pbVar22 < pbVar10) ||
                   (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                goto LAB_00111b6c;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                if ((pbVar22 < pbVar10 + sVar6) ||
                   (pbVar10 = pbVar10 + sVar6 + (long)local_98, pbVar22 < pbVar10))
                goto LAB_00111b6c;
                puVar14 = (uint64_t *)((long)puVar14 + 1);
              } while (puVar14 < local_90);
            }
            puVar18 = (uint32_t *)((long)puVar18 + 1);
          } while (puVar18 != local_a0);
        }
        if (pbVar22 < pbVar10) {
LAB_00111b6c:
          bVar23 = false;
          goto LAB_001114b8;
        }
        pbVar10 = pbVar10 + 4;
        if (pbVar10 <= pbVar22) {
          bVar23 = true;
          if (((flags & 2) != 0) && ((char)local_70 != '\0')) {
            if (local_a0 != (uint32_t *)0x0) {
              puVar18 = (uint32_t *)0x0;
              do {
                local_50 = puVar18;
                if ((pbVar22 < pbVar10) ||
                   (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                goto LAB_001114b6;
                local_78 = (wally_tx *)pbVar10;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                if ((pbVar22 < (byte *)((long)local_78 + sVar6)) ||
                   (pbVar10 = (byte *)((long)local_78 + sVar6) + (long)local_98, pbVar22 < pbVar10))
                goto LAB_001114b6;
                sVar6 = varint_length_from_bytes(pbVar10);
                if (pbVar22 < pbVar10 + sVar6) goto LAB_00111b6c;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                if (((pbVar22 < pbVar10 + sVar6) ||
                    (pbVar10 = pbVar10 + sVar6 + (long)local_98, pbVar22 < pbVar10)) ||
                   (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                goto LAB_00111b6c;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_90);
                pbVar10 = pbVar10 + sVar6;
                if (local_90 != (uint64_t *)0x0) {
                  puVar14 = (uint64_t *)0x0;
                  do {
                    if ((pbVar22 < pbVar10) ||
                       (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                    goto LAB_00111b6c;
                    sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                    if ((pbVar22 < pbVar10 + sVar6) ||
                       (pbVar10 = pbVar10 + sVar6 + (long)local_98, pbVar22 < pbVar10))
                    goto LAB_00111b6c;
                    puVar14 = (uint64_t *)((long)puVar14 + 1);
                  } while (puVar14 < local_90);
                }
                if ((pbVar22 < pbVar10) ||
                   (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                goto LAB_00112179;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_90);
                pbVar10 = pbVar10 + sVar6;
                if (local_90 != (uint64_t *)0x0) {
                  puVar14 = (uint64_t *)0x0;
                  do {
                    if ((pbVar22 < pbVar10) ||
                       (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                    goto LAB_00112179;
                    sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                    if ((pbVar22 < pbVar10 + sVar6) ||
                       (pbVar10 = pbVar10 + sVar6 + (long)local_98, pbVar22 < pbVar10))
                    goto LAB_00112179;
                    puVar14 = (uint64_t *)((long)puVar14 + 1);
                  } while (puVar14 < local_90);
                }
                puVar18 = (uint32_t *)((long)local_50 + 1);
              } while (puVar18 != local_a0);
            }
            bVar23 = true;
            if (local_88 != (uint32_t *)0x0) {
              puVar18 = local_88;
              do {
                if ((pbVar22 < pbVar10) ||
                   (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))
                goto LAB_00112179;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                if ((pbVar22 < pbVar10 + sVar6) ||
                   ((pbVar10 = pbVar10 + sVar6 + (long)local_98, pbVar22 < pbVar10 ||
                    (sVar6 = varint_length_from_bytes(pbVar10), pbVar22 < pbVar10 + sVar6))))
                goto LAB_00112179;
                sVar6 = varint_from_bytes(pbVar10,(uint64_t *)&local_98);
                if ((pbVar22 < pbVar10 + sVar6) ||
                   (pbVar10 = pbVar10 + sVar6 + (long)local_98, pbVar22 < pbVar10))
                goto LAB_00112179;
                puVar18 = (uint32_t *)((long)puVar18 + -1);
                bVar23 = true;
              } while (puVar18 != (uint32_t *)0x0);
            }
          }
          goto LAB_001114b8;
        }
      }
    }
  }
  else {
LAB_0011149b:
    local_88 = (uint32_t *)0x0;
    local_a0 = (uint32_t *)0x0;
    local_70 = 0;
  }
LAB_001114b6:
  bVar23 = false;
LAB_001114b8:
  iVar5 = -2;
  if ((bVar23) &&
     (iVar5 = wally_tx_init_alloc(0,0,(size_t)local_a0,(size_t)local_88,local_40), iVar5 == 0)) {
    local_78 = *local_40;
    local_78->version = *local_60;
    lVar20 = 5;
    if ((flags & 2) == 0) {
      lVar20 = (local_70 & 0xff) * 2 + 4;
    }
    puVar12 = (uchar *)(lVar20 + (long)local_60);
    sVar6 = varint_from_bytes(puVar12,(uint64_t *)&local_98);
    puVar18 = (uint32_t *)(puVar12 + sVar6);
    if (local_a0 != (uint32_t *)0x0) {
      local_54 = (flags & 2) >> 1;
      puVar19 = (uint32_t *)0x0;
      do {
        local_80 = 0;
        local_68 = 0;
        uVar2 = puVar18[8];
        sVar6 = varint_from_bytes((uchar *)(puVar18 + 9),(uint64_t *)&local_90);
        puVar12 = (uchar *)((long)puVar18 + sVar6 + 0x24);
        local_60 = (uint32_t *)((long)(puVar12 + (long)local_90) + 4);
        sequence = *(uint32_t *)(puVar12 + (long)local_90);
        local_50 = (uint32_t *)CONCAT44(local_50._4_4_,uVar2);
        if (((flags & 2) == 0) || (-1 < (int)uVar2)) {
LAB_001115f4:
          puVar17 = (uchar *)0x0;
          puVar14 = (uint64_t *)0x0;
          nonce = (uint32_t *)0x0;
          puVar13 = (uchar *)0x0;
        }
        else {
          if ((uVar2 == 0xffffffff) && ((char)*puVar18 == '\0')) {
            uVar7 = 0xffffffffffffffff;
            do {
              if (uVar7 == 0x1e) {
                uVar15 = 0x1f;
                break;
              }
              uVar15 = uVar7 + 1;
              lVar20 = uVar7 + 2;
              uVar7 = uVar15;
            } while (*(char *)((long)puVar18 + lVar20) == '\0');
            if (0x1e < uVar15) goto LAB_001115f4;
          }
          puVar13 = (uchar *)((long)local_90 + (long)puVar12);
          local_38 = puVar13 + 0x24;
          puVar17 = puVar13 + 0x44;
          sVar6 = confidential_value_varint_from_bytes(puVar17,&local_80);
          puVar14 = (uint64_t *)(puVar13 + sVar6 + 0x44);
          sVar6 = confidential_value_varint_from_bytes((uchar *)puVar14,&local_68);
          nonce = local_60;
          puVar13 = local_38;
          local_60 = (uint32_t *)(sVar6 + (long)puVar14);
        }
        if (local_90 == (uint64_t *)0x0) {
          puVar12 = (uchar *)0x0;
        }
        if (local_80 == 0) {
          puVar17 = (uchar *)0x0;
        }
        if (local_68 == 0) {
          puVar14 = (uint64_t *)0x0;
        }
        free_parent = 0x20;
        iVar5 = tx_elements_input_init
                          ((uchar *)puVar18,0x20,(uint32_t)local_50,sequence,puVar12,
                           (size_t)local_90,(wally_tx_witness_stack *)0x0,(uchar *)nonce,
                           (ulong)(nonce != (uint32_t *)0x0) << 5,puVar13,
                           (ulong)(puVar13 != (uchar *)0x0) << 5,puVar17,local_80,(uchar *)puVar14,
                           local_68,(uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,
                           local_78->inputs + (long)puVar19,SUB41(local_54,0));
        iVar21 = 5;
        if (iVar5 == 0) {
          local_78->num_inputs = local_78->num_inputs + 1;
          iVar21 = 0;
        }
        if (iVar21 != 0) goto joined_r0x00111922;
        puVar19 = (uint32_t *)((long)puVar19 + 1);
        puVar18 = local_60;
      } while (puVar19 != local_a0);
    }
    sVar6 = varint_from_bytes((uchar *)puVar18,(uint64_t *)&local_98);
    puVar18 = (uint32_t *)(sVar6 + (long)puVar18);
    if (local_88 != (uint32_t *)0x0) {
      local_54 = (flags & 2) >> 1;
      lVar20 = 0;
      puVar19 = local_88;
      do {
        local_80 = 0;
        local_68 = 0;
        local_48 = 0;
        local_60 = puVar19;
        if ((flags & 2) == 0) {
          local_50 = *(uint32_t **)puVar18;
          puVar19 = puVar18 + 2;
          puVar18 = (uint32_t *)0x0;
          puVar12 = (uchar *)0x0;
          puVar17 = (uchar *)0x0;
        }
        else {
          sVar6 = confidential_asset_varint_from_bytes((uchar *)puVar18,&local_80);
          puVar12 = (uchar *)(sVar6 + (long)puVar18);
          sVar6 = confidential_value_varint_from_bytes(puVar12,&local_68);
          puVar17 = puVar12 + sVar6;
          sVar6 = confidential_nonce_varint_from_bytes(puVar17,&local_48);
          puVar19 = (uint32_t *)(puVar17 + sVar6);
          local_50 = (uint32_t *)0xffffffffffffffff;
        }
        sVar6 = varint_from_bytes((uchar *)puVar19,(uint64_t *)&local_90);
        puVar14 = local_90;
        puVar13 = (uchar *)(sVar6 + (long)puVar19);
        if (local_90 == (uint64_t *)0x0) {
          puVar13 = (uchar *)0x0;
        }
        if (local_80 == 0) {
          puVar18 = (uint32_t *)0x0;
        }
        if (local_68 == 0) {
          puVar12 = (uchar *)0x0;
        }
        if (local_48 == 0) {
          puVar17 = (uchar *)0x0;
        }
        iVar5 = tx_elements_output_init
                          ((uint64_t)local_50,puVar13,(size_t)local_90,(uchar *)puVar18,local_80,
                           puVar12,local_68,puVar17,local_48,(uchar *)0x0,0,(uchar *)0x0,0,
                           (wally_tx_output *)((long)&local_78->outputs->satoshi + lVar20),
                           SUB41(local_54,0));
        free_parent = SUB81(puVar13,0);
        iVar21 = 5;
        if (iVar5 == 0) {
          local_78->num_outputs = local_78->num_outputs + 1;
          iVar21 = 0;
        }
        if (iVar21 != 0) goto joined_r0x00111922;
        puVar18 = (uint32_t *)((uchar *)(sVar6 + (long)puVar19) + (long)puVar14);
        lVar20 = lVar20 + 0x70;
        puVar19 = (uint32_t *)((long)local_60 + -1);
      } while (puVar19 != (uint32_t *)0x0);
    }
    if (((local_a0 != (uint32_t *)0x0) && ((flags & 2) == 0)) && ((char)local_70 != '\0')) {
      puVar19 = (uint32_t *)0x0;
      do {
        sVar6 = varint_from_bytes((uchar *)puVar18,(uint64_t *)&local_90);
        puVar18 = (uint32_t *)(sVar6 + (long)puVar18);
        if (local_90 != (uint64_t *)0x0) {
          output_00 = &local_78->inputs[(long)puVar19].witness;
          iVar5 = wally_tx_witness_stack_init_alloc((size_t)local_90,output_00);
          free_parent = SUB81(output_00,0);
          if (iVar5 != 0) goto LAB_00111d82;
          if (local_90 != (uint64_t *)0x0) {
            puVar14 = (uint64_t *)0x0;
            do {
              sVar6 = varint_from_bytes((uchar *)puVar18,&local_80);
              puVar16 = puVar14;
              iVar5 = wally_tx_witness_stack_set
                                (local_78->inputs[(long)puVar19].witness,(size_t)puVar14,
                                 (uchar *)(sVar6 + (long)puVar18),local_80);
              free_parent = SUB81(puVar16,0);
              if (iVar5 != 0) goto LAB_00111d82;
              puVar18 = (uint32_t *)((uchar *)(sVar6 + (long)puVar18) + local_80);
              puVar14 = (uint64_t *)((long)puVar14 + 1);
            } while (puVar14 < local_90);
          }
        }
        puVar19 = (uint32_t *)((long)puVar19 + 1);
      } while (puVar19 != local_a0);
    }
    pwVar3 = local_78;
    local_78->locktime = *puVar18;
    iVar5 = 0;
    if (((flags & 2) != 0) && (iVar5 = 0, (char)local_70 != '\0')) {
      puVar18 = puVar18 + 1;
      if (local_a0 != (uint32_t *)0x0) {
        lVar20 = 0;
        puVar14 = &local_48;
        do {
          sVar6 = varint_from_bytes((uchar *)puVar18,&local_80);
          puVar12 = (uchar *)((long)puVar18 + sVar6);
          puVar17 = puVar12 + local_80;
          sVar6 = varint_from_bytes(puVar17,&local_68);
          puVar17 = puVar17 + sVar6;
          if (local_80 == 0) {
            puVar12 = (uchar *)0x0;
          }
          puVar18 = (uint32_t *)(puVar17 + local_68);
          if (local_68 == 0) {
            puVar17 = (uchar *)0x0;
          }
          iVar5 = tx_elements_input_issuance_proof_init
                            ((wally_tx_input *)(pwVar3->inputs->txhash + lVar20),puVar12,local_80,
                             puVar17,local_68);
          free_parent = SUB81(puVar12,0);
          iVar21 = 5;
          if (iVar5 == 0) {
            puVar12 = pwVar3->inputs->blinding_nonce + lVar20 + -9;
            iVar5 = witness_stack_from_bytes
                              ((uchar *)puVar18,(wally_tx_witness_stack **)puVar12,puVar14);
            free_parent = SUB81(puVar12,0);
            if (iVar5 == 0) {
              puVar18 = (uint32_t *)((long)puVar18 + local_48);
              puVar12 = pwVar3->inputs->entropy + lVar20 + 0x67;
              iVar5 = witness_stack_from_bytes
                                ((uchar *)puVar18,(wally_tx_witness_stack **)puVar12,puVar14);
              free_parent = SUB81(puVar12,0);
              if (iVar5 == 0) {
                puVar18 = (uint32_t *)((long)puVar18 + local_48);
                iVar21 = 0;
                iVar5 = 0;
              }
            }
          }
          if (iVar21 != 0) goto joined_r0x00111922;
          lVar20 = lVar20 + 0xd0;
          local_a0 = (uint32_t *)((long)local_a0 + -1);
        } while (local_a0 != (uint32_t *)0x0);
      }
      iVar5 = 0;
      if (local_88 != (uint32_t *)0x0) {
        lVar20 = 0;
        do {
          sVar6 = varint_from_bytes((uchar *)puVar18,&local_80);
          puVar12 = (uchar *)((long)puVar18 + sVar6);
          puVar17 = puVar12 + local_80;
          sVar6 = varint_from_bytes(puVar17,&local_68);
          uVar4 = local_68;
          if (local_80 == 0) {
            puVar12 = (uchar *)0x0;
          }
          puVar13 = puVar17 + sVar6;
          if (local_68 == 0) {
            puVar13 = (uchar *)0x0;
          }
          iVar5 = tx_elements_output_proof_init
                            ((wally_tx_output *)((long)&local_78->outputs->satoshi + lVar20),puVar12
                             ,local_80,puVar13,local_68);
          free_parent = SUB81(puVar12,0);
          if (iVar5 != 0) goto LAB_00111d82;
          puVar18 = (uint32_t *)(puVar17 + sVar6 + uVar4);
          lVar20 = lVar20 + 0x70;
          iVar5 = 0;
          local_88 = (uint32_t *)((long)local_88 + -1);
        } while (local_88 != (uint32_t *)0x0);
      }
    }
  }
  return iVar5;
LAB_00112179:
  bVar23 = false;
  goto LAB_001114b8;
joined_r0x00111922:
  if (iVar21 != 5) {
    return (int)puVar14;
  }
LAB_00111d82:
  tx_free(local_78,(_Bool)free_parent);
  *local_40 = (wally_tx *)0x0;
  return iVar5;
}

Assistant:

static int tx_from_bytes(const unsigned char *bytes, size_t bytes_len,
                         uint32_t flags, struct wally_tx **output)
{
    const unsigned char *p = bytes;
    const bool is_elements = flags & WALLY_TX_FLAG_USE_ELEMENTS;
    bool expect_witnesses;
    size_t i, j, num_inputs, num_outputs;
    uint64_t tmp, num_witnesses;
    int ret;
    struct wally_tx *result;

    TX_CHECK_OUTPUT;

    if (analyze_tx(bytes, bytes_len, flags, &num_inputs, &num_outputs,
                   &expect_witnesses) != WALLY_OK)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(0, 0, num_inputs, num_outputs, output);
    if (ret != WALLY_OK)
        return ret;
    result = (struct wally_tx *)*output;

    p += uint32_from_le_bytes(p, &result->version);
    if (is_elements)
        p++; /* Skip witness flag */
    else if (expect_witnesses)
        p += 2; /* Skip flag bytes */
    p += varint_from_bytes(p, &tmp);

    for (i = 0; i < num_inputs; ++i) {
        const unsigned char *txhash = p, *script, *nonce = NULL, *entropy = NULL;
        const unsigned char *issuance_amount = NULL, *inflation_keys = NULL;
        uint32_t index, sequence;
        uint64_t script_len, issuance_amount_len = 0, inflation_keys_len = 0;
        p += WALLY_TXHASH_LEN;
        p += uint32_from_le_bytes(p, &index);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        p += uint32_from_le_bytes(p, &sequence);
        if (is_elements && !!(index & WALLY_TX_ISSUANCE_FLAG) && !is_coinbase_bytes(txhash, WALLY_TXHASH_LEN, index)) {
            nonce = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            entropy = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            issuance_amount = p;
            p += confidential_value_varint_from_bytes(p, &issuance_amount_len);
            inflation_keys = p;
            p += confidential_value_varint_from_bytes(p, &inflation_keys_len);
        }
        ret = tx_elements_input_init(txhash, WALLY_TXHASH_LEN, index, sequence,
                                     script_len ? script : NULL, script_len, NULL,
                                     nonce, nonce ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     entropy, entropy ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     issuance_amount_len ? issuance_amount : NULL, issuance_amount_len,
                                     inflation_keys_len ? inflation_keys : NULL, inflation_keys_len,
                                     NULL, 0, NULL, 0, NULL, &result->inputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_inputs += 1;
    }

    p += varint_from_bytes(p, &tmp);
    for (i = 0; i < num_outputs; ++i) {
        const unsigned char *script, *asset = NULL, *value = NULL, *nonce = NULL;
        uint64_t satoshi = -1, script_len, asset_len = 0, value_len = 0, nonce_len = 0;
        if (is_elements) {
            asset = p;
            p += confidential_asset_varint_from_bytes(p, &asset_len);
            value = p;
            p += confidential_value_varint_from_bytes(p, &value_len);
            nonce = p;
            p += confidential_nonce_varint_from_bytes(p, &nonce_len);
        } else
            p += uint64_from_le_bytes(p, &satoshi);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        ret = tx_elements_output_init(satoshi, script_len ? script : NULL, script_len,
                                      asset_len ? asset : NULL, asset_len,
                                      value_len ? value : NULL, value_len,
                                      nonce_len ? nonce : NULL, nonce_len,
                                      NULL, 0, NULL, 0,
                                      &result->outputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_outputs += 1;
    }

    if (expect_witnesses && !is_elements) {
        for (i = 0; i < num_inputs; ++i) {
            p += varint_from_bytes(p, &num_witnesses);
            if (!num_witnesses)
                continue;
            ret = wally_tx_witness_stack_init_alloc(num_witnesses,
                                                    &result->inputs[i].witness);
            if (ret != WALLY_OK)
                goto fail;

            for (j = 0; j < num_witnesses; ++j) {
                uint64_t witness_len;
                p += varint_from_bytes(p, &witness_len);
                ret = wally_tx_witness_stack_set(result->inputs[i].witness, j,
                                                 p, witness_len);
                if (ret != WALLY_OK)
                    goto fail;
                p += witness_len;
            }
        }
    }

    uint32_from_le_bytes(p, &result->locktime);

#ifdef BUILD_ELEMENTS

#define proof_from_bytes(dst, len) \
    p += varint_from_bytes(p, (len)); \
    (dst) = p; \
    p += *(len)

    if (expect_witnesses && is_elements) {
        p += sizeof(uint32_t);
        for (i = 0; i < num_inputs; ++i) {
            const unsigned char *issuance_amount_rangeproof, *inflation_keys_rangeproof;
            uint64_t issuance_amount_rangeproof_len, inflation_keys_rangeproof_len, offset;
            proof_from_bytes(issuance_amount_rangeproof, &issuance_amount_rangeproof_len);
            proof_from_bytes(inflation_keys_rangeproof, &inflation_keys_rangeproof_len);
            ret = tx_elements_input_issuance_proof_init(result->inputs + i,
                                                        issuance_amount_rangeproof_len ? issuance_amount_rangeproof : NULL,
                                                        issuance_amount_rangeproof_len,
                                                        inflation_keys_rangeproof_len ? inflation_keys_rangeproof : NULL,
                                                        inflation_keys_rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
            ret = witness_stack_from_bytes(p, &result->inputs[i].witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
            ret = witness_stack_from_bytes(p, &result->inputs[i].pegin_witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
        }

        for (i = 0; i < num_outputs; ++i) {
            const unsigned char *surjectionproof, *rangeproof;
            uint64_t surjectionproof_len, rangeproof_len;
            proof_from_bytes(surjectionproof, &surjectionproof_len);
            proof_from_bytes(rangeproof, &rangeproof_len);
            ret = tx_elements_output_proof_init(result->outputs + i,
                                                surjectionproof_len ? surjectionproof : NULL,
                                                surjectionproof_len,
                                                rangeproof_len ? rangeproof : NULL,
                                                rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
        }
    }

#undef proof_from_bytes

#endif /* BUILD_ELEMENTS */
    return WALLY_OK;
fail:
    tx_free(result, true);
    *output = NULL;
    return ret;
}